

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.hpp
# Opt level: O1

__string_type * __thiscall
qclab::qasm2_abi_cxx11_
          (__string_type *__return_storage_ptr__,qclab *this,char *type,int qubit0,int qubit1)

{
  size_t sVar1;
  ostream *poVar2;
  stringstream stream;
  stringstream local_1b0 [16];
  long local_1a0 [14];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  if (this == (qclab *)0x0) {
    std::ios::clear((int)(ostream *)local_1a0 + (int)*(undefined8 *)(local_1a0[0] + -0x18));
  }
  else {
    sVar1 = strlen((char *)this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)this,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," q[",3);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,(int)type);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"], q[",5);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,qubit0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"];\n",3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

inline auto qasm2( const char type[] , const int qubit0 , const int qubit1 ) {
    std::stringstream stream ;
    stream << type << " q[" << qubit0 << "], q[" << qubit1 << "];\n" ;
    return stream.str() ;
  }